

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Redux.h
# Opt level: O2

Scalar __thiscall
Eigen::DenseBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
redux<Eigen::internal::scalar_min_op<double,double,0>>
          (DenseBase<Eigen::Matrix<double,_1,1,0,_1,1>> *this,scalar_min_op<double,_double,_0> *func
          )

{
  Scalar SVar1;
  ThisEvaluator thisEval;
  evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_> local_8;
  
  if (0 < *(long *)(this + 8)) {
    local_8.m_d.data = *(plainobjectbase_evaluator_data<double,_0> *)this;
    SVar1 = internal::
            redux_impl<Eigen::internal::scalar_min_op<double,double,0>,Eigen::internal::redux_evaluator<Eigen::Matrix<double,-1,1,0,-1,1>>,3,0>
            ::run<Eigen::Matrix<double,_1,1,0,_1,1>>
                      ((redux_evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_8,func,
                       (Matrix<double,__1,_1,_0,__1,_1> *)this);
    return SVar1;
  }
  __assert_fail("this->rows()>0 && this->cols()>0 && \"you are using an empty matrix\"",
                "/workspace/llm4binary/github/license_c_cmakelists/usnistgov[P]ChebTools/externals/Eigen/Eigen/src/Core/Redux.h"
                ,0x19b,
                "typename internal::traits<Derived>::Scalar Eigen::DenseBase<Eigen::Matrix<double, -1, 1>>::redux(const Func &) const [Derived = Eigen::Matrix<double, -1, 1>, BinaryOp = Eigen::internal::scalar_min_op<double>]"
               );
}

Assistant:

EIGEN_DEVICE_FUNC EIGEN_STRONG_INLINE typename internal::traits<Derived>::Scalar
DenseBase<Derived>::redux(const Func& func) const
{
  eigen_assert(this->rows()>0 && this->cols()>0 && "you are using an empty matrix");

  typedef typename internal::redux_evaluator<Derived> ThisEvaluator;
  ThisEvaluator thisEval(derived());

  // The initial expression is passed to the reducer as an additional argument instead of
  // passing it as a member of redux_evaluator to help  
  return internal::redux_impl<Func, ThisEvaluator>::run(thisEval, func, derived());
}